

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void print_fasta_seq(kseq_t *seq,int n)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 *puVar7;
  char *in_RCX;
  long extraout_RDX;
  undefined4 in_register_00000034;
  undefined8 uVar8;
  char *pcVar9;
  FILE *__stream;
  void *__ptr;
  ulong in_R8;
  uint uVar10;
  ulong uVar11;
  
  uVar8 = CONCAT44(in_register_00000034,n);
  sVar1 = (seq->seq).l;
  __stream = (FILE *)(long)(n + 1);
  pcVar4 = (char *)malloc((size_t)__stream);
  if (pcVar4 == (char *)0x0) {
    print_fasta_seq_cold_1();
    sVar5 = strlen(in_RCX);
    pcVar4 = (char *)malloc(in_R8 + 1);
    if (pcVar4 != (char *)0x0) {
      uVar10 = (uint)sVar5;
      if (in_R8 < (ulong)(long)(int)uVar10) {
        if (extraout_RDX == 0) {
          fprintf(__stream,">%s\n",uVar8);
        }
        else {
          fprintf(__stream,">%s %s\n",uVar8,extraout_RDX);
        }
        uVar11 = 0;
        if (0 < (int)uVar10) {
          uVar11 = 0;
          iVar3 = 0;
          do {
            uVar6 = (ulong)iVar3;
            if (uVar6 < in_R8) {
              pcVar4[uVar6] = in_RCX[uVar11];
              iVar3 = iVar3 + 1;
            }
            else {
              pcVar4[uVar6] = '\0';
              fprintf(__stream,"%s\n",pcVar4);
              *pcVar4 = in_RCX[uVar11];
              iVar3 = 1;
            }
            uVar11 = uVar11 + 1;
          } while ((uVar10 & 0x7fffffff) != uVar11);
          uVar11 = (ulong)iVar3;
        }
        if (uVar11 < in_R8) {
          pcVar4[uVar11] = '\0';
        }
        if (*pcVar4 != '\0') {
          fprintf(__stream,"%s\n",pcVar4);
        }
      }
      else if (extraout_RDX == 0) {
        fprintf(__stream,">%s\n%s\n",uVar8,in_RCX);
      }
      else {
        fprintf(__stream,">%s %s\n%s\n",uVar8,extraout_RDX,in_RCX);
      }
      free(pcVar4);
      return;
    }
    print_fasta_cold_1();
    __ptr = (void *)0x48;
    puVar7 = (undefined8 *)malloc(0x48);
    if (puVar7 != (undefined8 *)0x0) {
      *puVar7 = 0;
      puVar7[1] = 0;
      *(undefined4 *)(puVar7 + 2) = 0;
      puVar7[3] = 0;
      puVar7[4] = 0;
      puVar7[5] = 0;
      puVar7[6] = 0;
      puVar7[7] = 0;
      puVar7[8] = 0;
      return;
    }
    seqdiff_results_init_cold_1();
    free(__ptr);
    return;
  }
  iVar3 = 0x32;
  if (0 < n) {
    iVar3 = n;
  }
  uVar10 = (uint)sVar1;
  if ((int)uVar10 <= iVar3) {
    pcVar9 = (seq->name).s;
    if ((seq->comment).l == 0) {
      printf(">%s\n%s\n",pcVar9,(seq->seq).s);
    }
    else {
      printf(">%s %s\n%s\n",pcVar9,(seq->comment).s,(seq->seq).s);
    }
    goto LAB_00104241;
  }
  if ((seq->comment).s == (char *)0x0) {
    pcVar9 = (seq->name).s;
LAB_001041c4:
    printf(">%s\n",pcVar9);
  }
  else {
    pcVar9 = (seq->name).s;
    if ((seq->comment).l == 0) goto LAB_001041c4;
    printf(">%s %s\n",pcVar9);
  }
  uVar11 = 0;
  iVar2 = 0;
  do {
    if (iVar2 < iVar3) {
      pcVar4[iVar2] = (seq->seq).s[uVar11];
      iVar2 = iVar2 + 1;
    }
    else {
      pcVar4[iVar2] = '\0';
      puts(pcVar4);
      *pcVar4 = (seq->seq).s[uVar11];
      iVar2 = 1;
    }
    uVar11 = uVar11 + 1;
  } while ((uVar10 & 0x7fffffff) != uVar11);
  if (iVar2 < iVar3) {
    pcVar4[iVar2] = '\0';
  }
  if (*pcVar4 != '\0') {
    puts(pcVar4);
  }
LAB_00104241:
  free(pcVar4);
  return;
}

Assistant:

void print_fasta_seq(kseq_t *seq, int n)
{
	int l = seq->seq.l;   /* sequence length */
	int x,i=0;
	char *seqbuf = NULL;
	seqbuf = (char *)malloc(sizeof(char) * (n + 1));
	if (seqbuf == NULL) {
		fprintf(stderr,"print_seq: out of memory for seqbuf!\n");
		exit(EXIT_FAILURE);
	}

	if (n <= 0)
		n = 50;

	if (l > n) {                  /* seqlength is > column length - split sequence */
		if (seq->comment.s == NULL) {
			printf(">%s\n",seq->name.s);
		} else {
			if (seq->comment.l == 0)
				printf(">%s\n",seq->name.s);
			else
				printf(">%s %s\n",seq->name.s, seq->comment.s);
		}

		for (x=0; x<l;x++) {
			if (i < n) {                     /* there's less sequence than the column width */
				seqbuf[i] = seq->seq.s[x];
				i++;
			} else {                         /* i is >= column width, so print this line */
				seqbuf[i] = '\0';            /* set last position in string to null */
				printf("%s\n",seqbuf);       /* print this line */
				i = 0;                       /* reset i */
				seqbuf[0] = '\0';            /* reset buffer */
				seqbuf[i] = seq->seq.s[x];   /* set this buffer line to current sequence char */
				i++;
			}
		}
		if (i<n)
			seqbuf[i] = '\0';
		if (strlen(seqbuf) > 0)
			printf("%s\n",seqbuf);
	} else {                     /* seqlength < column length, so just print the full sequence */
		if (seq->comment.l == 0)
			printf(">%s\n%s\n",seq->name.s,seq->seq.s);
		else
			printf(">%s %s\n%s\n",seq->name.s,seq->comment.s,seq->seq.s);
	}
	free(seqbuf);
}